

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration
          (EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y,int Theta)

{
  uint uVar1;
  uint uVar2;
  sbpl_xy_theta_pt_t pose;
  bool bVar3;
  pointer psVar4;
  reference pvVar5;
  pointer psVar6;
  int find;
  size_type __n;
  long lVar7;
  double dVar8;
  vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> footprint;
  _Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> local_a8;
  double local_88;
  double dStack_80;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  _Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> local_48;
  
  bVar3 = EnvironmentNAVXYTHETALATTICE::IsValidConfiguration
                    ((EnvironmentNAVXYTHETALATTICE *)this,X,Y,Theta);
  if (bVar3) {
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88 = (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
               EnvNAVXYTHETALATCfg.cellsize_m;
    dStack_80 = 0.0;
    local_70 = DiscTheta2Cont(Theta,(this->super_EnvironmentNAVXYTHETALAT).
                                    super_EnvironmentNAVXYTHETALATTICE.EnvNAVXYTHETALATCfg.
                                    NumThetaDirs);
    dStack_80 = local_88 * 0.5;
    dVar8 = local_88 * (double)Y;
    local_88 = dStack_80 + local_88 * (double)X;
    dStack_80 = dStack_80 + dVar8;
    psVar4 = (pointer)0x0;
    psVar6 = (pointer)0x0;
    for (lVar7 = 0; bVar3 = this->numofadditionalzlevs <= lVar7, lVar7 < this->numofadditionalzlevs;
        lVar7 = lVar7 + 1) {
      if (psVar4 != psVar6) {
        local_a8._M_impl.super__Vector_impl_data._M_finish = psVar6;
      }
      std::vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::vector
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_48,
                 this->AddLevelFootprintPolygonV + lVar7);
      local_68 = local_88;
      dStack_60 = dStack_80;
      local_58 = local_70;
      pose.y = dStack_80;
      pose.x = local_88;
      pose.theta = local_70;
      get_2d_footprint_cells
                ((vector<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_> *)&local_48,
                 (vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)&local_a8,pose,
                 (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
                 EnvNAVXYTHETALATCfg.cellsize_m);
      std::_Vector_base<sbpl_2Dpt_t,_std::allocator<sbpl_2Dpt_t>_>::~_Vector_base(&local_48);
      __n = 0;
      while ((long)__n <
             (long)(int)((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_a8._M_impl.super__Vector_impl_data._M_start) >> 3)) {
        pvVar5 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                           ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)&local_a8,__n);
        uVar1 = pvVar5->x;
        pvVar5 = std::vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::at
                           ((vector<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_> *)&local_a8,__n);
        if (((int)uVar1 < 0) ||
           ((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
            EnvNAVXYTHETALATCfg.EnvWidth_c <= (int)uVar1)) goto LAB_001345f2;
        uVar2 = pvVar5->y;
        if (((int)uVar2 < 0) ||
           (((this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
             EnvNAVXYTHETALATCfg.EnvHeight_c <= (int)uVar2 ||
            (__n = __n + 1,
            (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
            EnvNAVXYTHETALATCfg.obsthresh <= this->AddLevelGrid2D[lVar7][uVar1][uVar2]))))
        goto LAB_001345f2;
      }
      psVar4 = local_a8._M_impl.super__Vector_impl_data._M_finish;
      psVar6 = local_a8._M_impl.super__Vector_impl_data._M_start;
    }
LAB_001345f2:
    std::_Vector_base<sbpl_2Dcell_t,_std::allocator<sbpl_2Dcell_t>_>::~_Vector_base(&local_a8);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsValidConfiguration(int X, int Y, int Theta)
{
    //check the base footprint first
    if (!EnvironmentNAVXYTHETALAT::IsValidConfiguration(X, Y, Theta)) return false;

    //check the remaining levels now
    vector<sbpl_2Dcell_t> footprint;
    sbpl_xy_theta_pt_t pose;

    //compute continuous pose
    pose.x = DISCXY2CONT(X, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.y = DISCXY2CONT(Y, EnvNAVXYTHETALATCfg.cellsize_m);
    pose.theta = DiscTheta2Cont(Theta, EnvNAVXYTHETALATCfg.NumThetaDirs);

    //iterate over additional levels
    for (int levind = 0; levind < numofadditionalzlevs; levind++) {

        //compute footprint cells
        footprint.clear();
        get_2d_footprint_cells(AddLevelFootprintPolygonV[levind], &footprint, pose, EnvNAVXYTHETALATCfg.cellsize_m);

        //iterate over all footprint cells
        for (int find = 0; find < (int)footprint.size(); find++) {
            int x = footprint.at(find).x;
            int y = footprint.at(find).y;

            if (x < 0 || x >= EnvNAVXYTHETALATCfg.EnvWidth_c || y < 0 || y >= EnvNAVXYTHETALATCfg.EnvHeight_c
                || AddLevelGrid2D[levind][x][y] >= EnvNAVXYTHETALATCfg.obsthresh) {
                return false;
            }
        }
    }

    return true;
}